

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall Units::setUnits(Units *this,Options *options)

{
  int iVar1;
  int unitSystem;
  Options *options_local;
  Units *this_local;
  
  iVar1 = Options::flowUnits(options);
  iVar1 = setFlowFactor(this,iVar1);
  Options::setOption(options,UNIT_SYSTEM,iVar1);
  setPressureFactor(this,iVar1,options);
  setOtherFactors(this,iVar1);
  return;
}

Assistant:

void Units::setUnits(Options &options)
{
    // ... flow units determines flow conversion factor and units system

    int unitSystem = setFlowFactor(options.flowUnits());
    options.setOption(Options::UNIT_SYSTEM, unitSystem);

    // ... assign pressure conversion factor

    setPressureFactor(unitSystem, options);

    // ... assign conversion factors for other quantities

    setOtherFactors(unitSystem);
}